

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManComputeDistanceInt(Gia_Man_t *p,int iTarg,Vec_Int_t *vObjs,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  Vec_Int_t *p_00;
  int *piVar9;
  Vec_Int_t *vRes;
  Vec_Int_t *vDists;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  Vec_Int_t t;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_00->pArray = piVar9;
  vRes = (Vec_Int_t *)malloc(0x10);
  vRes->nCap = 100;
  vRes->nSize = 0;
  piVar9 = (int *)malloc(400);
  vRes->pArray = piVar9;
  uVar1 = p->nObjs;
  vDists = (Vec_Int_t *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar7 = uVar1;
  }
  vDists->nCap = uVar7;
  if (uVar7 == 0) {
    vDists->pArray = (int *)0x0;
    vDists->nSize = uVar1;
  }
  else {
    piVar9 = (int *)malloc((long)(int)uVar7 << 2);
    vDists->pArray = piVar9;
    vDists->nSize = uVar1;
    if (piVar9 != (int *)0x0) {
      memset(piVar9,0,(long)(int)uVar1 << 2);
      goto LAB_002484fd;
    }
  }
  piVar9 = (int *)0x0;
LAB_002484fd:
  Gia_ManIncrementTravId(p);
  if (vObjs == (Vec_Int_t *)0x0) {
    if (p->nTravIdsAlloc <= iTarg) {
LAB_002486a2:
      __assert_fail("Id < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
    }
    p->pTravIds[iTarg] = p->nTravIds;
    if ((iTarg < 0) || ((int)uVar1 <= iTarg)) {
LAB_002486c1:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
    }
    piVar9[(uint)iTarg] = 1;
    Vec_IntPush(p_00,iTarg);
  }
  else if (0 < vObjs->nSize) {
    lVar11 = 0;
    do {
      uVar7 = vObjs->pArray[lVar11];
      if (p->nTravIdsAlloc <= (int)uVar7) goto LAB_002486a2;
      p->pTravIds[(int)uVar7] = p->nTravIds;
      if (((int)uVar7 < 0) || ((int)uVar1 <= (int)uVar7)) goto LAB_002486c1;
      piVar9[uVar7] = 1;
      Vec_IntPush(p_00,uVar7);
      lVar11 = lVar11 + 1;
    } while (lVar11 < vObjs->nSize);
  }
  uVar12 = 0;
  while( true ) {
    if (fVerbose != 0) {
      if ((int)uVar1 < 1) {
        iVar8 = 0;
      }
      else {
        uVar10 = 0;
        iVar8 = 0;
        do {
          iVar8 = iVar8 + (uint)(piVar9[uVar10] == 0);
          uVar10 = uVar10 + 1;
        } while (uVar1 != uVar10);
      }
      printf("Ring %2d : %6d\n",uVar12,(ulong)(uVar1 - iVar8));
    }
    Gia_ManCollectRing(p,p_00,vRes,vDists);
    if (vRes->nSize == 0) break;
    p_00->nSize = 0;
    iVar8 = p_00->nCap;
    iVar2 = p_00->nSize;
    piVar3 = p_00->pArray;
    iVar4 = vRes->nSize;
    uVar5 = *(undefined4 *)&vRes->pArray;
    uVar6 = *(undefined4 *)((long)&vRes->pArray + 4);
    p_00->nCap = vRes->nCap;
    p_00->nSize = iVar4;
    *(undefined4 *)&p_00->pArray = uVar5;
    *(undefined4 *)((long)&p_00->pArray + 4) = uVar6;
    vRes->nCap = iVar8;
    vRes->nSize = iVar2;
    vRes->pArray = piVar3;
    uVar12 = (ulong)((int)uVar12 + 1);
  }
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  if (vRes->pArray != (int *)0x0) {
    free(vRes->pArray);
  }
  free(vRes);
  return vDists;
}

Assistant:

Vec_Int_t * Gia_ManComputeDistanceInt( Gia_Man_t * p, int iTarg, Vec_Int_t * vObjs, int fVerbose )
{
    int i, iObj;
    Vec_Int_t * vDists, * vStart, * vNexts;
    vStart = Vec_IntAlloc( 100 );
    vNexts = Vec_IntAlloc( 100 );
    vDists = Vec_IntStart( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    if ( vObjs )
    {
        Vec_IntForEachEntry( vObjs, iObj, i )
        {
            Gia_ObjSetTravIdCurrentId(p, iObj);
            Vec_IntWriteEntry( vDists, iObj, 1 );
            Vec_IntPush( vStart, iObj );
        }
    }
    else
    {
        Gia_ObjSetTravIdCurrentId(p, iTarg);
        Vec_IntWriteEntry( vDists, iTarg, 1 );
        Vec_IntPush( vStart, iTarg );
    }
    for ( i = 0; ; i++ )
    {
        if ( fVerbose )
            printf( "Ring %2d : %6d\n", i, Vec_IntSize(vDists)-Vec_IntCountZero(vDists) );        
        Gia_ManCollectRing( p, vStart, vNexts, vDists );
        if ( Vec_IntSize(vNexts) == 0 )
            break;
        Vec_IntClear( vStart );
        ABC_SWAP( Vec_Int_t, *vStart, *vNexts );
    }
    Vec_IntFree( vStart );
    Vec_IntFree( vNexts );
    return vDists;
}